

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall chrono::utils::Generator::writeObjectInfo(Generator *this,string *filename)

{
  pointer pBVar1;
  CSV_writer *pCVar2;
  long lVar3;
  int i;
  ulong uVar4;
  allocator local_1f1;
  string local_1f0;
  string *local_1d0;
  CSV_writer csv;
  
  std::__cxx11::string::string((string *)&local_1f0,",",&local_1f1);
  local_1d0 = filename;
  CSV_writer::CSV_writer(&csv,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  lVar3 = 0;
  for (uVar4 = 0;
      pBVar1 = (this->m_bodies).
               super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->m_bodies).
                             super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x38);
      uVar4 = uVar4 + 1) {
    local_1f0._M_dataplus._M_p._0_4_ =
         *(undefined4 *)((long)(pBVar1->m_size).m_data + lVar3 + -0x10);
    CSV_writer::operator<<(&csv,(int *)&local_1f0);
    pCVar2 = utils::operator<<(&csv,(ChVector<double> *)
                                    (*(long *)((long)&(((shared_ptr<chrono::ChBody> *)
                                                       (&((this->m_bodies).
                                                                                                                    
                                                  super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_size
                                                  + 1))->
                                                  super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar3) + 0x80));
    utils::operator<<(pCVar2,(ChVector<double> *)
                             ((long)(((this->m_bodies).
                                      super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                             lVar3));
    pCVar2 = CSV_writer::operator<<
                       (&csv,(double *)
                             ((long)(((this->m_bodies).
                                      super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                             lVar3 + -8));
    local_1f0._M_dataplus._M_p =
         *(pointer *)
          (*(long *)((long)&(((shared_ptr<chrono::ChBody> *)
                             (&((this->m_bodies).
                                super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_size + 1))->
                            super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                    lVar3) + 0x2e8);
    CSV_writer::operator<<(pCVar2,(double *)&local_1f0);
    std::endl<char,std::char_traits<char>>((ostream *)&csv.m_ss);
    lVar3 = lVar3 + 0x38;
  }
  std::__cxx11::string::string((string *)&local_1f0,"",&local_1f1);
  CSV_writer::write_to_file(&csv,local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  CSV_writer::~CSV_writer(&csv);
  return;
}

Assistant:

void Generator::writeObjectInfo(const std::string& filename) {
    CSV_writer csv;

    for (int i = 0; i < m_bodies.size(); i++) {
        csv << static_cast<int>(m_bodies[i].m_type);
        csv << m_bodies[i].m_body->GetPos() << m_bodies[i].m_size;
        csv << m_bodies[i].m_density << m_bodies[i].m_body->GetMass();

        //// RADU: write collision shape information, including contact material properties?

        csv << std::endl;
    }

    csv.write_to_file(filename);
}